

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

string * __thiscall pbrt::syntactic::ParamSet::getParamString(ParamSet *this,string *name)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  element_type *peVar3;
  undefined4 extraout_var;
  runtime_error *this_00;
  string *in_RDI;
  shared_ptr<pbrt::syntactic::ParamArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  p;
  shared_ptr<pbrt::syntactic::Param> pr;
  const_iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
  *in_stack_fffffffffffffed8;
  shared_ptr<pbrt::syntactic::Param> *in_stack_fffffffffffffee0;
  ParamArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffee8;
  string *__r;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  char *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  string local_c8 [39];
  undefined1 local_a1;
  string local_80 [32];
  __shared_ptr local_60 [55];
  allocator<char> local_29;
  _Self local_28;
  _Self local_20 [4];
  char *__rhs;
  
  __r = in_RDI;
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
       ::find(in_stack_fffffffffffffed8,(key_type *)0x15fe46);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
       ::end(in_stack_fffffffffffffed8);
  bVar1 = std::operator==(local_20,&local_28);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    std::allocator<char>::~allocator(&local_29);
  }
  else {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
                  *)0x15feea);
    std::shared_ptr<pbrt::syntactic::Param>::shared_ptr
              (in_stack_fffffffffffffee0,
               (shared_ptr<pbrt::syntactic::Param> *)in_stack_fffffffffffffed8);
    std::
    dynamic_pointer_cast<pbrt::syntactic::ParamArray<std::__cxx11::string>,pbrt::syntactic::Param>
              ((shared_ptr<pbrt::syntactic::Param> *)__r);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_60);
    if (!bVar1) {
      local_a1 = 1;
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x10);
      std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      std::operator+(__lhs,(char *)in_stack_fffffffffffffee0);
      std::runtime_error::runtime_error((runtime_error *)__lhs,local_80);
      local_a1 = 0;
      __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar3 = std::
             __shared_ptr_access<pbrt::syntactic::ParamArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::ParamArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x160036);
    iVar2 = (*(peVar3->super_Param)._vptr_Param[1])();
    __rhs = (char *)CONCAT44(extraout_var,iVar2);
    if (__rhs != (char *)0x1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffee8,__rhs);
      std::runtime_error::runtime_error(this_00,local_c8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::
    __shared_ptr_access<pbrt::syntactic::ParamArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<pbrt::syntactic::ParamArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x16015d);
    ParamArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    get(in_stack_fffffffffffffee8,(size_t)__rhs);
    std::
    shared_ptr<pbrt::syntactic::ParamArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~shared_ptr((shared_ptr<pbrt::syntactic::ParamArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x16017d);
    std::shared_ptr<pbrt::syntactic::Param>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::Param> *)0x16018a);
  }
  return in_RDI;
}

Assistant:

std::string ParamSet::getParamString(const std::string &name) const
    {
      std::map<std::string,std::shared_ptr<Param> >::const_iterator it=param.find(name);
      if (it == param.end())
        return "";
      std::shared_ptr<Param> pr = it->second;
      const std::shared_ptr<ParamArray<std::string>> p = std::dynamic_pointer_cast<ParamArray<std::string>>(pr);
      if (!p)
        throw std::runtime_error("str: found param of given name ("+name+"), but of wrong type!");
      if (p->getSize() != 1)
        throw std::runtime_error("found param of given name and type, but wrong number of components! (str, name='"+name+"'");
      return p->get(0);
    }